

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getCropBox
          (QPDFPageObjectHelper *this,bool copy_if_shared,bool copy_if_fallback)

{
  byte in_CL;
  uint uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  QPDFPageObjectHelper *name;
  QPDFObjectHandle QVar2;
  anon_class_16_2_ac2d7678 local_88;
  function<QPDFObjectHandle_()> local_78;
  allocator<char> local_41;
  string local_40 [38];
  byte local_1a;
  byte local_19;
  bool copy_if_fallback_local;
  QPDFPageObjectHelper *pQStack_18;
  bool copy_if_shared_local;
  QPDFPageObjectHelper *this_local;
  
  name = (QPDFPageObjectHelper *)CONCAT71(in_register_00000031,copy_if_shared);
  local_1a = in_CL & 1;
  local_19 = copy_if_fallback;
  pQStack_18 = name;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/CropBox",&local_41);
  uVar1 = (uint)local_19;
  local_88.copy_if_shared = (bool)(local_19 & 1);
  local_88.this = name;
  std::function<QPDFObjectHandle()>::function<QPDFPageObjectHelper::getCropBox(bool,bool)::__0,void>
            ((function<QPDFObjectHandle()> *)&local_78,&local_88);
  getAttribute(this,(string *)name,SUB81(local_40,0),
               (function<QPDFObjectHandle_()> *)(ulong)(uVar1 & 1),SUB81(&local_78,0));
  std::function<QPDFObjectHandle_()>::~function(&local_78);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getCropBox(bool copy_if_shared, bool copy_if_fallback)
{
    return getAttribute(
        "/CropBox",
        copy_if_shared,
        [this, copy_if_shared]() { return this->getMediaBox(copy_if_shared); },
        copy_if_fallback);
}